

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_seed_tests.cpp
# Opt level: O1

void __thiscall iu_Foo_x_iutest_x_Bar_Test::Body(iu_Foo_x_iutest_x_Bar_Test *this)

{
  Variable *pVVar1;
  uint *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1e9;
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  if (seed == 0) {
    iutest::UnitTest::instance();
    pVVar1 = iutest::TestEnv::get_vars();
    local_190._0_4_ = pVVar1->m_current_random_seed;
    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (&local_1e8,(internal *)"kSeed","::iutest::UnitTest::GetInstance()->random_seed()",
               (char *)&kSeed,(uint *)local_190,in_R9);
    if (local_1e8.m_result != false) goto LAB_001140e4;
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1e9);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x24;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
  }
  else {
    iutest::UnitTest::instance();
    pVVar1 = iutest::TestEnv::get_vars();
    local_190._0_4_ = pVVar1->m_current_random_seed;
    if (seed == local_190._0_4_) {
      Body();
    }
    else {
      local_1e8.m_message._M_dataplus._M_p = (pointer)&local_1e8.m_message.field_2;
      local_1e8.m_message._M_string_length = 0;
      local_1e8.m_message.field_2._M_local_buf[0] = '\0';
      local_1e8.m_result = true;
    }
    if (local_1e8.m_result != false) goto LAB_001140e4;
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1e9);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/random_seed_tests.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x28;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
LAB_001140e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    CONCAT71(local_1e8.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1e8.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(Foo, Bar)
{
    if( seed == 0 )
    {
        IUTEST_ASSERT_EQ(kSeed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
    else
    {
        IUTEST_ASSERT_NE(seed, ::iutest::UnitTest::GetInstance()->random_seed());
    }
}